

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg2StreamReader.cpp
# Opt level: O0

int __thiscall MPEG2StreamReader::processSeqStartCode(MPEG2StreamReader *this,uint8_t *buff)

{
  uint8_t *nextNal_00;
  uint8_t *puVar1;
  int oldSpsLen;
  BitStreamException *e;
  uint8_t *nextNal;
  uint8_t *buff_local;
  MPEG2StreamReader *this_local;
  
  nextNal_00 = MPEGHeader::findNextMarker
                         (buff,(this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd);
  if (nextNal_00 == (this->super_MPEGStreamReader).super_AbstractStreamReader.m_bufEnd) {
    this_local._4_4_ = -10;
  }
  else {
    puVar1 = MPEGSequenceHeader::deserialize
                       (&this->m_sequence,buff + 1,(int64_t)(nextNal_00 + ~(ulong)buff));
    if (puVar1 == (uint8_t *)0x0) {
      this_local._4_4_ = 3;
    }
    else {
      (this->super_MPEGStreamReader).m_streamAR = (uint)(this->m_sequence).aspect_ratio_info;
      MPEGStreamReader::updateFPS(&this->super_MPEGStreamReader,(void *)0x0,buff,nextNal_00,0);
      this->spsFound = true;
      this->m_lastIFrame = true;
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int MPEG2StreamReader::processSeqStartCode(uint8_t* buff)
{
    uint8_t* nextNal = MPEGHeader::findNextMarker(buff, m_bufEnd);
    if (nextNal == m_bufEnd)
    {
        return NOT_ENOUGH_BUFFER;
    }
    try
    {
        if (m_sequence.deserialize(buff + 1, nextNal - buff - 1) == nullptr)
            return NALUnit::UNSUPPORTED_PARAM;
        m_streamAR = static_cast<VideoAspectRatio>(m_sequence.aspect_ratio_info);
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
    constexpr int oldSpsLen = 0;
    updateFPS(nullptr, buff, nextNal, oldSpsLen);
    spsFound = true;
    m_lastIFrame = true;
    return 0;
}